

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

size_t __thiscall adios2::core::Engine::DoSteps(Engine *this)

{
  string *in_stack_000000b8;
  Engine *in_stack_000000c0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"DoSteps",&local_29);
  ThrowUp(in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return 0xffffffffffffffff;
}

Assistant:

size_t Engine::DoSteps() const
{
    ThrowUp("DoSteps");
    return MaxSizeT;
}